

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O0

void process_io_events(void)

{
  int iVar1;
  LispPTR *pLVar2;
  u_int *flags;
  int i;
  u_int iflags;
  fd_set rfds;
  
  memcpy(&i,&LispReadFds,0x80);
  iVar1 = select(0x20,(fd_set *)&i,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&SelectTimeout);
  if (0 < iVar1) {
    flags._4_4_ = 0;
    for (flags._0_4_ = 0; (int)flags < 0x20; flags._0_4_ = (int)flags + 1) {
      if ((*(ulong *)(&i + (long)((int)flags / 0x40) * 2) &
          1L << ((byte)((long)(int)flags % 0x40) & 0x3f)) != 0 &&
          (LispIOFds.__fds_bits[(int)flags / 0x40] & 1L << ((byte)((long)(int)flags % 0x40) & 0x3f))
          != 0) {
        flags._4_4_ = 1 << ((byte)(int)flags & 0x1f) | flags._4_4_;
      }
    }
    if (flags._4_4_ != 0) {
      pLVar2 = NativeAligned4FromLAddr(*IOINTERRUPTFLAGS_word);
      *pLVar2 = flags._4_4_;
      pLVar2 = NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
      *(ushort *)((long)pLVar2 + 2) = *(ushort *)((long)pLVar2 + 2) & 0xdfff | 0x2000;
      *PENDINGINTERRUPT68k = 0x4c;
      MachineState.irqcheck = 0;
      MachineState.irqend = 0;
    }
  }
  return;
}

Assistant:

void process_io_events(void)
{
#ifndef DOS
  fd_set rfds;
  u_int iflags;
  int i;

  memcpy(&rfds, &LispReadFds, sizeof(rfds));

  if (select(32, &rfds, NULL, NULL, &SelectTimeout) > 0) {

#ifdef MAIKO_ENABLE_ETHERNET
    if (ether_fd >= 0 && FD_ISSET(ether_fd, &rfds)) { /* Raw ethernet (NIT) I/O happened, so handle it. */
      DBPRINT(("Handling enet interrupt.\n\n"));
      check_ether();
    }
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef MAIKO_ENABLE_NETHUB
    check_ether();
#endif /* MAIKO_ENABLE_NETHUB */

#ifdef RS232
    if (RS232C_Fd >= 0 && (FD_ISSET(RS232C_Fd, &rfds) || (RS232C_remain_data && rs232c_lisp_is_ready())))
      rs232c_read();
#endif /* RS232 */

#if defined(MAIKO_HANDLE_CONSOLE_MESSAGES) && defined(LOGINT)
    if (LogFileFd >= 0 && FD_ISSET(LogFileFd, &rfds)) { /* There's info in the log file.  Tell Lisp to print it. */
      flush_pty();          /* move the msg(s) to the log file */

      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->LogFileIO = 1;

      *PENDINGINTERRUPT68k = ATOM_T;
      Irq_Stk_End = Irq_Stk_Check = 0;
    }
#endif
    iflags = 0;
    for (i = 0; i < 32; i++)
        if (FD_ISSET(i, &rfds) & FD_ISSET(i, &LispIOFds)) iflags |= 1 << i;
    if (iflags) { /* There's activity on a Lisp-opened FD.  Tell Lisp. */
      u_int *flags;
      flags = (u_int *)NativeAligned4FromLAddr(*IOINTERRUPTFLAGS_word);
      *flags = iflags;

      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->IOInterrupt = 1;

      *PENDINGINTERRUPT68k = ATOM_T;
      Irq_Stk_End = Irq_Stk_Check = 0;
    }
  }
/* #endif */
#endif /* DOS */
}